

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# combinator.hpp
# Opt level: O1

result<toml::detail::region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::detail::none_t>
* __thiscall
toml::detail::
exclude<toml::detail::either<toml::detail::in_range<(char)0,(char)8>,toml::detail::in_range<(char)16,(char)25>,toml::detail::character<(char)39>>>
::invoke<std::__cxx11::string>
          (result<toml::detail::region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::detail::none_t>
           *__return_storage_ptr__,
          exclude<toml::detail::either<toml::detail::in_range<(char)0,(char)8>,toml::detail::in_range<(char)16,(char)25>,toml::detail::character<(char)39>>>
          *this,location<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *loc)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  const_iterator f;
  element_type *peVar4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  size_type sVar6;
  result<toml::detail::region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::detail::none_t>
  rslt;
  region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_100
  ;
  region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_b8;
  result<toml::detail::region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::detail::none_t>
  local_70;
  
  f._M_current = *(char **)(this + 0x40);
  if (f._M_current == (char *)(**(long **)(this + 8) + (*(long **)(this + 8))[1])) {
    __return_storage_ptr__->is_ok_ = false;
  }
  else {
    either<toml::detail::in_range<(char)0,(char)8>,toml::detail::in_range<(char)16,(char)25>,toml::detail::character<(char)39>>
    ::invoke<std::__cxx11::string>
              (&local_70,
               (either<toml::detail::in_range<(char)0,(char)8>,toml::detail::in_range<(char)16,(char)25>,toml::detail::character<(char)39>>
                *)this,loc);
    if (local_70.is_ok_ == true) {
      location<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((location<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)this,f);
      __return_storage_ptr__->is_ok_ = false;
    }
    else {
      location<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((location<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)this,(const_iterator)(f._M_current + 1));
      region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      region(&local_b8,
             (location<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)this,(const_iterator)f._M_current,(const_iterator)*(char **)(this + 0x40));
      sVar6 = local_b8.source_name_._M_string_length;
      _Var5._M_pi = local_b8.source_.
                    super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi;
      peVar4 = local_b8.source_.
               super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      paVar2 = &local_100.source_name_.field_2;
      local_100.super_region_base._vptr_region_base = (_func_int **)&PTR__region_00160c48;
      paVar3 = &local_b8.source_name_.field_2;
      local_b8.source_.
      super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)0x0;
      local_b8.source_.
      super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8.source_name_._M_dataplus._M_p == paVar3) {
        local_100.source_name_.field_2._8_8_ = local_b8.source_name_.field_2._8_8_;
        local_100.source_name_._M_dataplus._M_p = (pointer)paVar2;
      }
      else {
        local_100.source_name_._M_dataplus._M_p = local_b8.source_name_._M_dataplus._M_p;
      }
      local_100.source_name_.field_2._M_allocated_capacity._1_7_ =
           local_b8.source_name_.field_2._M_allocated_capacity._1_7_;
      local_100.source_name_.field_2._M_local_buf[0] = local_b8.source_name_.field_2._M_local_buf[0]
      ;
      local_b8.source_name_._M_string_length = 0;
      local_b8.source_name_.field_2._M_local_buf[0] = '\0';
      local_100.first_._M_current = local_b8.first_._M_current;
      local_100.last_._M_current = local_b8.last_._M_current;
      __return_storage_ptr__->is_ok_ = true;
      (__return_storage_ptr__->field_1).succ.value.super_region_base._vptr_region_base =
           (_func_int **)&PTR__region_00160c48;
      (__return_storage_ptr__->field_1).succ.value.source_.
      super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = peVar4;
      (__return_storage_ptr__->field_1).succ.value.source_.
      super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_100.source_.
      super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      (__return_storage_ptr__->field_1).succ.value.source_.
      super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = _Var5._M_pi;
      local_100.source_.
      super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)0x0;
      paVar1 = &(__return_storage_ptr__->field_1).succ.value.source_name_.field_2;
      *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        **)((long)&__return_storage_ptr__->field_1 + 0x18) = paVar1;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100.source_name_._M_dataplus._M_p == paVar2) {
        paVar1->_M_allocated_capacity = local_100.source_name_.field_2._M_allocated_capacity;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->field_1).succ.value.source_name_.field_2 + 8) =
             local_100.source_name_.field_2._8_8_;
      }
      else {
        (__return_storage_ptr__->field_1).succ.value.source_name_._M_dataplus._M_p =
             local_100.source_name_._M_dataplus._M_p;
        (__return_storage_ptr__->field_1).succ.value.source_name_.field_2._M_allocated_capacity =
             local_100.source_name_.field_2._M_allocated_capacity;
      }
      (__return_storage_ptr__->field_1).succ.value.source_name_._M_string_length = sVar6;
      local_100.source_name_._M_string_length = 0;
      local_100.source_name_.field_2._M_allocated_capacity =
           (ulong)(uint7)local_b8.source_name_.field_2._M_allocated_capacity._1_7_ << 8;
      (__return_storage_ptr__->field_1).succ.value.first_._M_current = local_b8.first_._M_current;
      (__return_storage_ptr__->field_1).succ.value.last_._M_current = local_b8.last_._M_current;
      local_100.source_name_._M_dataplus._M_p = (pointer)paVar2;
      local_b8.source_name_._M_dataplus._M_p = (pointer)paVar3;
      region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~region(&local_100);
      region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~region(&local_b8);
    }
    if (local_70.is_ok_ == true) {
      region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~region(&local_70.field_1.succ.value);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static result<region<Cont>, none_t>
    invoke(location<Cont>& loc)
    {
        static_assert(std::is_same<char, typename Cont::value_type>::value,
                      "internal error: container::value_type should be `char`.");

        if(loc.iter() == loc.end()) {return none();}
        auto first = loc.iter();

        auto rslt = Combinator::invoke(loc);
        if(rslt.is_ok())
        {
            loc.reset(first);
            return none();
        }
        loc.reset(std::next(first)); // XXX maybe loc.advance() is okay but...
        return ok(region<Cont>(loc, first, loc.iter()));
    }